

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

Vec_Int_t * Vec_IntStartNatural(int nSize)

{
  Vec_Int_t *pVVar1;
  int local_1c;
  int i;
  Vec_Int_t *p;
  int nSize_local;
  
  pVVar1 = Vec_IntAlloc(nSize);
  pVVar1->nSize = nSize;
  for (local_1c = 0; local_1c < nSize; local_1c = local_1c + 1) {
    pVVar1->pArray[local_1c] = local_1c;
  }
  return pVVar1;
}

Assistant:

static inline Vec_Int_t * Vec_IntStartNatural( int nSize )
{
    Vec_Int_t * p;
    int i;
    p = Vec_IntAlloc( nSize );
    p->nSize = nSize;
    for ( i = 0; i < nSize; i++ )
        p->pArray[i] = i;
    return p;
}